

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_drawMarks(void)

{
  double x;
  ulong uVar1;
  long lVar2;
  FTexture *tex;
  
  lVar2 = 0;
  do {
    x = *(double *)((long)&markpoints[0].x + lVar2 * 4);
    if ((x != -1.0) || (NAN(x))) {
      uVar1 = (ulong)*(int *)((long)&marknums[0].texnum + lVar2);
      if (uVar1 < TexMan.Textures.Count) {
        tex = TexMan.Textures.Array[TexMan.Translation.Array[uVar1]].Texture;
      }
      else {
        tex = (FTexture *)0x0;
      }
      DrawMarker(tex,x,*(double *)((long)&markpoints[0].y + lVar2 * 4),-3,0,1.0,1.0,0,1.0,0,
                 LegacyRenderStyles[1]);
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x28);
  return;
}

Assistant:

void AM_drawMarks ()
{
	for (int i = 0; i < AM_NUMMARKPOINTS; i++)
	{
		if (markpoints[i].x != -1)
		{
			DrawMarker (TexMan(marknums[i]), markpoints[i].x, markpoints[i].y, -3, 0,
				1, 1, 0, 1, 0, LegacyRenderStyles[STYLE_Normal]);
		}
	}
}